

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_dma_read.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  ssize_t sVar4;
  char **in_RSI;
  int in_EDI;
  char buf [4096];
  uint16_t devn;
  uint16_t busn;
  uintptr_t addr;
  nettlp nt;
  int size;
  int ch;
  int ret;
  undefined4 in_stack_ffffffffffffefa8;
  undefined4 in_stack_ffffffffffffefac;
  void *in_stack_ffffffffffffefb0;
  undefined1 local_1048 [72];
  size_t in_stack_fffffffffffff000;
  void *in_stack_fffffffffffff008;
  uintptr_t in_stack_fffffffffffff010;
  nettlp *in_stack_fffffffffffff018;
  ushort local_44;
  short local_42;
  uintptr_t local_40;
  undefined1 local_34 [4];
  undefined1 auStack_30 [4];
  ushort local_2c;
  undefined1 local_2a;
  int local_1c;
  int local_18;
  uint local_14;
  char **local_10;
  int local_8;
  undefined4 local_4;
  
  local_4 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  memset(local_34,0,0x18);
  local_1c = 4;
  local_40 = 0;
  local_42 = 0;
  local_44 = 0;
  do {
    local_18 = getopt(local_8,local_10,"r:l:b:t:a:s:");
    if (local_18 == -1) {
      local_14 = nettlp_init((nettlp *)CONCAT44(in_stack_ffffffffffffefac,in_stack_ffffffffffffefa8)
                            );
      if ((int)local_14 < 0) {
        perror("nettlp_init");
        return local_14;
      }
      dump_nettlp((nettlp *)0x1026ea);
      memset(local_1048,0,0x1000);
      sVar4 = dma_read(in_stack_fffffffffffff018,in_stack_fffffffffffff010,in_stack_fffffffffffff008
                       ,in_stack_fffffffffffff000);
      local_14 = (uint)sVar4;
      uVar2 = tlp_calculate_length(local_40,(long)local_1c);
      printf("tlp_length is %u\n",(ulong)uVar2);
      printf("\n\n");
      printf("dma_read returns %d\n",(ulong)local_14);
      printf("\n");
      uVar2 = tlp_calculate_lstdw(local_40,(long)local_1c);
      uVar3 = tlp_calculate_fstdw(local_40,(long)local_1c);
      printf("Last 0x%x, 1st 0x%x\n",(ulong)uVar2,(ulong)uVar3);
      printf("dma_read returns %d\n",(ulong)local_14);
      if ((int)local_14 < 0) {
        perror("dma_read");
      }
      if (0 < (int)local_14) {
        hexdump(in_stack_ffffffffffffefb0,uVar2);
      }
      return 0;
    }
    in_stack_ffffffffffffefb0 = (void *)(ulong)(local_18 - 0x61);
    switch(in_stack_ffffffffffffefb0) {
    case (void *)0x0:
      local_14 = __isoc99_sscanf(_optarg,"0x%lx",&local_40);
      break;
    case (void *)0x1:
      local_14 = __isoc99_sscanf(_optarg,"%hx:%hx",&local_42,&local_44);
      local_2c = local_42 << 8 | local_44;
      break;
    default:
      usage();
      return -1;
    case (void *)0xb:
      local_14 = inet_pton(2,_optarg,auStack_30);
      if ((int)local_14 < 1) {
        perror("inet_pton");
        return -1;
      }
      break;
    case (void *)0x11:
      local_14 = inet_pton(2,_optarg,local_34);
      if ((int)local_14 < 1) {
        perror("inet_pton");
        return -1;
      }
      break;
    case (void *)0x12:
      local_1c = atoi(_optarg);
      if ((local_1c < 1) || (0x1000 < local_1c)) {
        fprintf(_stderr,"size must be 0 > | < 4096\n");
        return -1;
      }
      break;
    case (void *)0x13:
      iVar1 = atoi(_optarg);
      local_2a = (undefined1)iVar1;
    }
  } while( true );
}

Assistant:

int main(int argc, char **argv)
{
	int ret, ch, size;
	struct nettlp nt;
	uintptr_t addr;
	uint16_t busn, devn;
	char buf[4096];

	memset(&nt, 0, sizeof(nt));
	size = 4;
	addr = 0;
	busn = 0;
	devn = 0;

	while ((ch = getopt(argc, argv, "r:l:b:t:a:s:")) != -1) {
		switch (ch) {
		case 'r':
			ret = inet_pton(AF_INET, optarg, &nt.remote_addr);
			if (ret < 1) {
				perror("inet_pton");
				return -1;
			}
			break;

		case 'l':
			ret = inet_pton(AF_INET, optarg, &nt.local_addr);
			if (ret < 1) {
				perror("inet_pton");
				return -1;
			}
			break;

		case 'b':
			ret = sscanf(optarg, "%hx:%hx", &busn, &devn);
			nt.requester = (busn << 8 | devn);
			break;

		case 't':
			nt.tag = atoi(optarg);
			break;

		case 'a':
			ret = sscanf(optarg, "0x%lx", &addr);
			break;

		case 's':
			size = atoi(optarg);
			if (size < 1 || size > 4096) {
				fprintf(stderr, "size must be 0 > | < 4096\n");
				return -1;
			}
			break;

		default :
			usage();
			return -1;
		}
	}

	ret = nettlp_init(&nt);
	if (ret < 0) {
		perror("nettlp_init");
		return ret;
	}
	dump_nettlp(&nt);

	memset(buf, 0, sizeof(buf));


	ret = dma_read(&nt, addr, buf, size);

	printf("tlp_length is %u\n", tlp_calculate_length(addr, size));


	printf("\n\n");
	printf("dma_read returns %d\n", ret);
	printf("\n");
	printf("Last 0x%x, 1st 0x%x\n",
	       tlp_calculate_lstdw(addr, size),
	       tlp_calculate_fstdw(addr, size));

	printf("dma_read returns %d\n", ret);
	if (ret < 0)
		perror("dma_read");


	if (ret > 0)
		hexdump(buf, size);


	return 0;
}